

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *pcVar2;
  Snapshot snapshot;
  bool bVar3;
  cmGlobalGenerator *this_00;
  char *pcVar4;
  cmLocalGenerator *pcVar5;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  allocator local_d1;
  string file;
  string homeOutputDir;
  string homeDir;
  string local_68;
  Snapshot local_48;
  
  pcVar1 = this->GlobalGenerator;
  this_00 = pcVar1;
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((Snapshot *)&homeDir,this->State);
    (this->CurrentSnapshot).Position.Position = homeDir.field_2._M_allocated_capacity;
    (this->CurrentSnapshot).State = (cmState *)homeDir._M_dataplus._M_p;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmState::SnapshotDataType> *)homeDir._M_string_length;
    pcVar4 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)&homeDir,pcVar4,(allocator *)&homeOutputDir);
    pcVar4 = GetHomeOutputDirectory(this);
    std::__cxx11::string::string((string *)&homeOutputDir,pcVar4,(allocator *)&file);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse);
    SetHomeDirectory(this,&file);
    std::__cxx11::string::~string((string *)&file);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,&file);
    std::__cxx11::string::~string((string *)&file);
    cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
    snapshot.Position.Tree = local_48.Position.Tree;
    snapshot.State = local_48.State;
    snapshot.Position.Position = local_48.Position.Position;
    pcVar5 = cmGlobalGenerator::MakeLocalGenerator(this_00,snapshot,(cmLocalGenerator *)0x0);
    pcVar2 = pcVar5->Makefile;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_01);
    cmMakefile::SetCurrentBinaryDirectory(pcVar2,&file);
    std::__cxx11::string::~string((string *)&file);
    pcVar2 = pcVar5->Makefile;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_02);
    cmMakefile::SetCurrentSourceDirectory(pcVar2,&file);
    std::__cxx11::string::~string((string *)&file);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      std::__cxx11::string::string((string *)&local_68,path,&local_d1);
      cmsys::SystemTools::CollapseFullPath(&file,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      cmsys::SystemTools::ConvertToUnixSlashes(&file);
      cmMakefile::SetScriptModeFile(pcVar5->Makefile,file._M_dataplus._M_p);
      cmMakefile::SetArgcArgv(pcVar5->Makefile,args);
      std::__cxx11::string::~string((string *)&file);
    }
    bVar3 = cmMakefile::ReadListFile(pcVar5->Makefile,path);
    if (!bVar3) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    SetHomeDirectory(this,&homeDir);
    SetHomeOutputDirectory(this,&homeOutputDir);
    (*pcVar5->_vptr_cmLocalGenerator[1])(pcVar5);
    std::__cxx11::string::~string((string *)&homeOutputDir);
    std::__cxx11::string::~string((string *)&homeDir);
  }
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char *path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg)
    {
    gg = new cmGlobalGenerator(this);
    created = true;
    }

  // read in the list file to fill the cache
  if(path)
    {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
    lg->GetMakefile()->SetCurrentBinaryDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    lg->GetMakefile()->SetCurrentSourceDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    if (this->GetWorkingMode() != NORMAL_MODE)
      {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      lg->GetMakefile()->SetScriptModeFile(file.c_str());

      lg->GetMakefile()->SetArgcArgv(args);
      }
    if (!lg->GetMakefile()->ReadListFile(path))
      {
      cmSystemTools::Error("Error processing file: ", path);
      }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
    }

  // free generic one if generated
  if (created)
    {
    delete gg;
    }
}